

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::ConflictPoolPropagation::conflictAdded(ConflictPoolPropagation *this,HighsInt conflict)

{
  pointer pWVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  HighsConflictPool *pHVar5;
  pointer ppVar6;
  pointer pHVar7;
  pointer puVar8;
  HighsInt HVar9;
  HighsBoundType HVar10;
  uint uVar11;
  double *pdVar12;
  int iVar13;
  HighsBoundType *pHVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  vector<int,_std::allocator<int>_> *pvVar20;
  long lVar21;
  int iVar22;
  bool bVar23;
  int aiStack_64 [5];
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  pHVar5 = this->conflictpool_;
  local_38 = (long)conflict;
  ppVar6 = (pHVar5->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar16 = ppVar6[local_38].first;
  iVar3 = ppVar6[local_38].second;
  if (*(int *)&(this->conflictFlag_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
      *(int *)&(this->conflictFlag_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start <= conflict) {
    std::
    vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
    ::resize(&this->watchedLiterals_,(long)(conflict * 2 + 2));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->conflictFlag_,(long)(conflict + 1));
  }
  local_40 = (ulong)(uint)conflict;
  uVar19 = conflict * 2;
  uVar17 = (ulong)uVar19;
  iVar22 = 0;
  local_50 = (long)iVar16;
  iVar15 = iVar3 - iVar16;
  local_48 = uVar17;
  if (iVar15 != 0) {
    lVar21 = (long)iVar16 << 4;
    iVar22 = 0;
    do {
      pHVar7 = (pHVar5->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar2 = *(double *)((long)&pHVar7->boundval + lVar21);
      iVar13 = *(int *)((long)&pHVar7->column + lVar21);
      if (*(int *)((long)&pHVar7->boundtype + lVar21) == 0) {
        bVar23 = (this->domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar13] < dVar2;
      }
      else {
        bVar23 = dVar2 < (this->domain->col_upper_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar13];
      }
      if (bVar23) {
        pdVar12 = (double *)((long)&pHVar7->boundval + lVar21);
        iVar13 = iVar22 + (int)uVar17;
        dVar2 = pdVar12[1];
        pWVar1 = (this->watchedLiterals_).
                 super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar13;
        (pWVar1->domchg).boundval = *pdVar12;
        *(double *)&(pWVar1->domchg).column = dVar2;
        linkWatchedLiteral(this,iVar13);
        uVar19 = (uint)local_48;
        iVar22 = iVar22 + 1;
        uVar17 = local_48;
        if (iVar22 == 2) break;
      }
      uVar19 = (uint)uVar17;
      lVar21 = lVar21 + 0x10;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  if (iVar22 == 0) {
    aiStack_64[1] = 0;
    aiStack_64[2] = 0;
    uVar11 = 0;
    if (iVar3 != iVar16) {
      aiStack_64[0] = 0;
      aiStack_64[1] = 0;
      aiStack_64[2] = 0;
      pHVar14 = &(pHVar5->conflictEntries_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start[local_50].boundtype;
      uVar11 = 0;
      iVar15 = 0;
      do {
        pvVar20 = &this->domain->colUpperPos_;
        if (*pHVar14 == kLower) {
          pvVar20 = &this->domain->colLowerPos_;
        }
        iVar13 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[(int)pHVar14[-1]];
        if (uVar11 == 2) {
          uVar11 = 2;
          iVar18 = aiStack_64[2];
          if (aiStack_64[1] < iVar13) goto LAB_00295585;
        }
        else {
          if (uVar11 == 1) {
LAB_00295585:
            uVar11 = 2;
            aiStack_64[1] = iVar13;
            aiStack_64[2] = aiStack_64[0];
            iVar18 = iVar16;
            if (iVar13 <= iVar15) goto LAB_002955b0;
          }
          else {
            uVar11 = 1;
            iVar15 = aiStack_64[1];
          }
          aiStack_64[0] = iVar16;
          aiStack_64[1] = iVar15;
          iVar18 = aiStack_64[2];
          iVar15 = iVar13;
        }
LAB_002955b0:
        aiStack_64[2] = iVar18;
        iVar16 = iVar16 + 1;
        pHVar14 = pHVar14 + 4;
      } while (iVar3 != iVar16);
      uVar19 = (uint)local_48;
    }
    if (uVar11 != 0) {
      lVar21 = (long)(int)uVar19 * 0x18;
      uVar17 = 0;
      do {
        pHVar7 = (pHVar5->conflictEntries_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start + aiStack_64[uVar17 * 2];
        dVar2 = *(double *)&pHVar7->column;
        pdVar12 = (double *)
                  ((long)&(((this->watchedLiterals_).
                            super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                            ._M_impl.super__Vector_impl_data._M_start)->domchg).boundval + lVar21);
        *pdVar12 = pHVar7->boundval;
        pdVar12[1] = dVar2;
        linkWatchedLiteral(this,(int)local_48 + (int)uVar17);
        uVar17 = uVar17 + 1;
        lVar21 = lVar21 + 0x18;
      } while (uVar11 != uVar17);
    }
    iVar15 = (int)local_40;
  }
  else {
    iVar15 = (int)local_40;
    if (iVar22 == 1) {
      iVar13 = -1;
      if (iVar3 != iVar16) {
        pHVar14 = &(pHVar5->conflictEntries_).
                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl
                   .super__Vector_impl_data._M_start[local_50].boundtype;
        iVar18 = -1;
        iVar13 = -1;
        do {
          pvVar20 = &this->domain->colUpperPos_;
          if (*pHVar14 == kLower) {
            pvVar20 = &this->domain->colLowerPos_;
          }
          iVar4 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[(int)pHVar14[-1]];
          if (iVar18 < iVar4) {
            iVar18 = iVar4;
            iVar13 = iVar16;
          }
          pHVar14 = pHVar14 + 4;
          iVar16 = iVar16 + 1;
        } while (iVar3 != iVar16);
      }
      if (iVar13 != -1) {
        iVar16 = iVar15 * 2 + 1;
        pHVar7 = (pHVar5->conflictEntries_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar13;
        HVar9 = pHVar7->column;
        HVar10 = pHVar7->boundtype;
        pWVar1 = (this->watchedLiterals_).
                 super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar16;
        (pWVar1->domchg).boundval = pHVar7->boundval;
        (pWVar1->domchg).column = HVar9;
        (pWVar1->domchg).boundtype = HVar10;
        linkWatchedLiteral(this,iVar16);
      }
    }
  }
  puVar8 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar8[local_38] = (byte)iVar22 | puVar8[local_38] & 4;
  markPropagateConflict(this,iVar15);
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::conflictAdded(HighsInt conflict) {
  HighsInt start = conflictpool_->getConflictRanges()[conflict].first;
  HighsInt end = conflictpool_->getConflictRanges()[conflict].second;
  const std::vector<HighsDomainChange>& conflictEntries =
      conflictpool_->getConflictEntryVector();

  if (HighsInt(conflictFlag_.size()) <= conflict) {
    watchedLiterals_.resize(2 * conflict + 2);
    conflictFlag_.resize(conflict + 1);
  }

  HighsInt numWatched = 0;
  for (HighsInt i = start; i != end; ++i) {
    if (domain->isActive(conflictEntries[i])) continue;
    HighsInt watchPos = 2 * conflict + numWatched;
    watchedLiterals_[watchPos].domchg = conflictEntries[i];
    linkWatchedLiteral(watchPos);
    if (++numWatched == 2) break;
  }
  switch (numWatched) {
    case 0: {
      std::array<std::pair<HighsInt, HighsInt>, 2> latestActive;
      HighsInt numActive = 0;
      for (HighsInt i = start; i != end; ++i) {
        HighsInt pos = conflictEntries[i].boundtype == HighsBoundType::kLower
                           ? domain->colLowerPos_[conflictEntries[i].column]
                           : domain->colUpperPos_[conflictEntries[i].column];
        switch (numActive) {
          case 0:
            latestActive[0] = std::make_pair(pos, i);
            numActive = 1;
            break;
          case 1:
            latestActive[1] = std::make_pair(pos, i);
            numActive = 2;
            if (latestActive[0].first < latestActive[1].first)
              std::swap(latestActive[0], latestActive[1]);
            break;
          case 2:
            if (pos > latestActive[1].first) {
              latestActive[1] = std::make_pair(pos, i);
              if (latestActive[0].first < latestActive[1].first)
                std::swap(latestActive[0], latestActive[1]);
            }
        }
      }
      for (HighsInt i = 0; i < numActive; ++i) {
        HighsInt watchPos = 2 * conflict + i;
        watchedLiterals_[watchPos].domchg =
            conflictEntries[latestActive[i].second];
        linkWatchedLiteral(watchPos);
      }
      break;
    }
    case 1: {
      HighsInt latestActive = -1;
      HighsInt latestPos = -1;

      for (HighsInt i = start; i != end; ++i) {
        HighsInt pos = conflictEntries[i].boundtype == HighsBoundType::kLower
                           ? domain->colLowerPos_[conflictEntries[i].column]
                           : domain->colUpperPos_[conflictEntries[i].column];
        if (pos > latestPos) {
          latestActive = i;
          latestPos = pos;
        }
      }
      if (latestActive != -1) {
        HighsInt watchPos = 2 * conflict + 1;
        watchedLiterals_[watchPos].domchg = conflictEntries[latestActive];
        linkWatchedLiteral(watchPos);
      }
      break;
    }
    case 2:
      break;
  }

  conflictFlag_[conflict] = numWatched | (conflictFlag_[conflict] & 4);
  markPropagateConflict(conflict);
}